

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_2cdd::GetOneFrameSegment
               (double current_vuv,int noise_size,double **spectrogram,int fft_size,
               double **aperiodicity,int f0_length,double frame_period,double current_time,
               double fractional_time_shift,int fs,ForwardRealFFT *forward_real_fft,
               InverseRealFFT *inverse_real_fft,MinimumPhaseAnalysis *minimum_phase,
               double *dc_remover,double *response,RandnState *randn_state)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  double *aperiodic_response_00;
  double *periodic_response_00;
  double *spectral_envelope_00;
  double *aperiodic_spectrum;
  double dVar6;
  int local_84;
  int i;
  double sqrt_noise_size;
  double *aperiodic_ratio;
  double *spectral_envelope;
  double *periodic_response;
  double *aperiodic_response;
  int fs_local;
  double fractional_time_shift_local;
  double current_time_local;
  double frame_period_local;
  int f0_length_local;
  double **aperiodicity_local;
  int fft_size_local;
  double **spectrogram_local;
  int noise_size_local;
  double current_vuv_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)fft_size;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  aperiodic_response_00 = (double *)operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)fft_size;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  periodic_response_00 = (double *)operator_new__(uVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)fft_size;
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  spectral_envelope_00 = (double *)operator_new__(uVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)fft_size;
  uVar5 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  aperiodic_spectrum = (double *)operator_new__(uVar5);
  GetSpectralEnvelope(current_time,frame_period,f0_length,spectrogram,fft_size,spectral_envelope_00)
  ;
  GetAperiodicRatio(current_time,frame_period,f0_length,aperiodicity,fft_size,aperiodic_spectrum);
  GetPeriodicResponse(fft_size,spectral_envelope_00,aperiodic_spectrum,current_vuv,inverse_real_fft,
                      minimum_phase,dc_remover,fractional_time_shift,fs,periodic_response_00);
  GetAperiodicResponse
            (noise_size,fft_size,spectral_envelope_00,aperiodic_spectrum,current_vuv,
             forward_real_fft,inverse_real_fft,minimum_phase,aperiodic_response_00,randn_state);
  dVar6 = sqrt((double)noise_size);
  for (local_84 = 0; local_84 < fft_size; local_84 = local_84 + 1) {
    response[local_84] =
         (periodic_response_00[local_84] * dVar6 + aperiodic_response_00[local_84]) /
         (double)fft_size;
  }
  if (spectral_envelope_00 != (double *)0x0) {
    operator_delete__(spectral_envelope_00);
  }
  if (aperiodic_spectrum != (double *)0x0) {
    operator_delete__(aperiodic_spectrum);
  }
  if (periodic_response_00 != (double *)0x0) {
    operator_delete__(periodic_response_00);
  }
  if (aperiodic_response_00 != (double *)0x0) {
    operator_delete__(aperiodic_response_00);
  }
  return;
}

Assistant:

static void GetOneFrameSegment(double current_vuv, int noise_size,
    const double * const *spectrogram, int fft_size,
    const double * const *aperiodicity, int f0_length, double frame_period,
    double current_time, double fractional_time_shift, int fs,
    const ForwardRealFFT *forward_real_fft,
    const InverseRealFFT *inverse_real_fft,
    const MinimumPhaseAnalysis *minimum_phase, const double *dc_remover,
    double *response, RandnState* randn_state) {
  double *aperiodic_response = new double[fft_size];
  double *periodic_response = new double[fft_size];

  double *spectral_envelope = new double[fft_size];
  double *aperiodic_ratio = new double[fft_size];
  GetSpectralEnvelope(current_time, frame_period, f0_length, spectrogram,
      fft_size, spectral_envelope);
  GetAperiodicRatio(current_time, frame_period, f0_length, aperiodicity,
      fft_size, aperiodic_ratio);

  // Synthesis of the periodic response
  GetPeriodicResponse(fft_size, spectral_envelope, aperiodic_ratio,
      current_vuv, inverse_real_fft, minimum_phase, dc_remover,
      fractional_time_shift, fs, periodic_response);

  // Synthesis of the aperiodic response
  GetAperiodicResponse(noise_size, fft_size, spectral_envelope,
      aperiodic_ratio, current_vuv, forward_real_fft,
      inverse_real_fft, minimum_phase, aperiodic_response, randn_state);

  double sqrt_noise_size = sqrt(static_cast<double>(noise_size));
  for (int i = 0; i < fft_size; ++i)
    response[i] =
      (periodic_response[i] * sqrt_noise_size + aperiodic_response[i]) /
      fft_size;

  delete[] spectral_envelope;
  delete[] aperiodic_ratio;
  delete[] periodic_response;
  delete[] aperiodic_response;
}